

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O3

char * ngx_http_charset_map_block(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  ngx_int_t nVar4;
  ngx_int_t nVar5;
  ngx_int_t *pnVar6;
  void *pvVar7;
  char *pcVar8;
  ngx_conf_t *pnVar9;
  undefined8 *puVar10;
  long lVar11;
  byte bVar12;
  undefined8 local_b8;
  ngx_conf_t pvcf;
  ngx_http_charset_conf_ctx_t ctx;
  
  bVar12 = 0;
  pvVar7 = cf->args->elts;
  nVar4 = ngx_http_add_charset((ngx_array_t *)conf,(ngx_str_t *)((long)pvVar7 + 0x10));
  if (nVar4 == -1) {
    return (char *)0xffffffffffffffff;
  }
  nVar5 = ngx_http_add_charset((ngx_array_t *)conf,(ngx_str_t *)((long)pvVar7 + 0x20));
  if (nVar5 != -1) {
    if (nVar4 == nVar5) {
      pcVar8 = "\"charset_map\" between the same charsets \"%V\" and \"%V\"";
LAB_0016241c:
      ngx_conf_log_error(1,cf,0,pcVar8,(ngx_str_t *)((long)pvVar7 + 0x10),
                         (ngx_str_t *)((long)pvVar7 + 0x20));
    }
    else {
      lVar11 = *(long *)((long)conf + 0x30);
      if (lVar11 != 0) {
        plVar1 = (long *)((ngx_array_t *)((long)conf + 0x28))->elts;
        lVar2 = *plVar1;
        lVar3 = plVar1[1];
        do {
          if (nVar5 == lVar3 && nVar4 == lVar2 || lVar3 == nVar4 && lVar2 == nVar5) {
            pcVar8 = "duplicate \"charset_map\" between \"%V\" and \"%V\"";
            goto LAB_0016241c;
          }
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pnVar6 = (ngx_int_t *)ngx_array_push((ngx_array_t *)((long)conf + 0x28));
      if (pnVar6 != (ngx_int_t *)0x0) {
        *pnVar6 = nVar4;
        pnVar6[1] = nVar5;
        nVar4 = ngx_strcasecmp(*(u_char **)((long)pvVar7 + 0x28),(u_char *)"utf-8");
        if (nVar4 == 0) {
          pvVar7 = ngx_pcalloc(cf->pool,0x400);
          pnVar6[2] = (ngx_int_t)pvVar7;
          if (pvVar7 != (void *)0x0) {
            pvVar7 = ngx_pcalloc(cf->pool,0x800);
            pnVar6[3] = (ngx_int_t)pvVar7;
            if (pvVar7 != (void *)0x0) {
              pvVar7 = ngx_pcalloc(cf->pool,0x100);
              if (pvVar7 == (void *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              *(void **)pnVar6[3] = pvVar7;
              lVar11 = 0;
              do {
                lVar2 = pnVar6[2];
                *(undefined1 *)(lVar2 + lVar11 * 4) = 1;
                *(char *)(lVar2 + 1 + lVar11 * 4) = (char)lVar11;
                *(char *)((long)pvVar7 + lVar11) = (char)lVar11;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x80);
              lVar11 = 0;
              do {
                *(undefined2 *)(pnVar6[2] + 0x200 + lVar11 * 4) = 0x3f01;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x80);
              goto LAB_001624d7;
            }
          }
        }
        else {
          pvVar7 = ngx_palloc(cf->pool,0x100);
          pnVar6[2] = (ngx_int_t)pvVar7;
          if (pvVar7 != (void *)0x0) {
            pvVar7 = ngx_palloc(cf->pool,0x100);
            pnVar6[3] = (ngx_int_t)pvVar7;
            if (pvVar7 == (void *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            lVar11 = 0;
            do {
              *(char *)(pnVar6[2] + lVar11) = (char)lVar11;
              *(char *)(pnVar6[3] + lVar11) = (char)lVar11;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x80);
            lVar11 = 0;
            do {
              *(undefined1 *)(pnVar6[2] + 0x80 + lVar11) = 0x3f;
              *(undefined1 *)(pnVar6[3] + 0x80 + lVar11) = 0x3f;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x80);
LAB_001624d7:
            pnVar9 = cf;
            puVar10 = &local_b8;
            pvcf.handler_conf = (char *)pnVar6;
            for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
              *puVar10 = pnVar9->name;
              pnVar9 = (ngx_conf_t *)((long)pnVar9 + (ulong)bVar12 * -0x10 + 8);
              puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
            }
            cf->ctx = &pvcf.handler_conf;
            cf->handler = ngx_http_charset_map;
            cf->handler_conf = (char *)conf;
            pcVar8 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
            puVar10 = &local_b8;
            for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
              cf->name = (char *)*puVar10;
              puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
              cf = (ngx_conf_t *)((long)cf + (ulong)bVar12 * -0x10 + 8);
            }
            return pcVar8;
          }
        }
      }
    }
  }
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_charset_map_block(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_charset_main_conf_t  *mcf = conf;

    char                         *rv;
    u_char                       *p, *dst2src, **pp;
    ngx_int_t                     src, dst;
    ngx_uint_t                    i, n;
    ngx_str_t                    *value;
    ngx_conf_t                    pvcf;
    ngx_http_charset_t           *charset;
    ngx_http_charset_tables_t    *table;
    ngx_http_charset_conf_ctx_t   ctx;

    value = cf->args->elts;

    src = ngx_http_add_charset(&mcf->charsets, &value[1]);
    if (src == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    dst = ngx_http_add_charset(&mcf->charsets, &value[2]);
    if (dst == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    if (src == dst) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "\"charset_map\" between the same charsets "
                           "\"%V\" and \"%V\"", &value[1], &value[2]);
        return NGX_CONF_ERROR;
    }

    table = mcf->tables.elts;
    for (i = 0; i < mcf->tables.nelts; i++) {
        if ((src == table->src && dst == table->dst)
             || (src == table->dst && dst == table->src))
        {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "duplicate \"charset_map\" between "
                               "\"%V\" and \"%V\"", &value[1], &value[2]);
            return NGX_CONF_ERROR;
        }
    }

    table = ngx_array_push(&mcf->tables);
    if (table == NULL) {
        return NGX_CONF_ERROR;
    }

    table->src = src;
    table->dst = dst;

    if (ngx_strcasecmp(value[2].data, (u_char *) "utf-8") == 0) {
        table->src2dst = ngx_pcalloc(cf->pool, 256 * NGX_UTF_LEN);
        if (table->src2dst == NULL) {
            return NGX_CONF_ERROR;
        }

        table->dst2src = ngx_pcalloc(cf->pool, 256 * sizeof(void *));
        if (table->dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        dst2src = ngx_pcalloc(cf->pool, 256);
        if (dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        pp = (u_char **) &table->dst2src[0];
        pp[0] = dst2src;

        for (i = 0; i < 128; i++) {
            p = &table->src2dst[i * NGX_UTF_LEN];
            p[0] = '\1';
            p[1] = (u_char) i;
            dst2src[i] = (u_char) i;
        }

        for (/* void */; i < 256; i++) {
            p = &table->src2dst[i * NGX_UTF_LEN];
            p[0] = '\1';
            p[1] = '?';
        }

    } else {
        table->src2dst = ngx_palloc(cf->pool, 256);
        if (table->src2dst == NULL) {
            return NGX_CONF_ERROR;
        }

        table->dst2src = ngx_palloc(cf->pool, 256);
        if (table->dst2src == NULL) {
            return NGX_CONF_ERROR;
        }

        for (i = 0; i < 128; i++) {
            table->src2dst[i] = (u_char) i;
            table->dst2src[i] = (u_char) i;
        }

        for (/* void */; i < 256; i++) {
            table->src2dst[i] = '?';
            table->dst2src[i] = '?';
        }
    }

    charset = mcf->charsets.elts;

    ctx.table = table;
    ctx.charset = &charset[dst];
    ctx.characters = 0;

    pvcf = *cf;
    cf->ctx = &ctx;
    cf->handler = ngx_http_charset_map;
    cf->handler_conf = conf;

    rv = ngx_conf_parse(cf, NULL);

    *cf = pvcf;

    if (ctx.characters) {
        n = ctx.charset->length;
        ctx.charset->length /= ctx.characters;

        if (((n * 10) / ctx.characters) % 10 > 4) {
            ctx.charset->length++;
        }
    }

    return rv;
}